

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

TimerId __thiscall mario::EventLoop::runEvery(EventLoop *this,double interval,TimerCallback *cb)

{
  Timestamp TVar1;
  pointer this_00;
  TimerId TVar2;
  Timestamp time;
  TimerCallback *cb_local;
  double interval_local;
  EventLoop *this_local;
  
  TVar1 = Timestamp::now();
  TVar1 = addTime(TVar1,interval);
  this_00 = std::unique_ptr<mario::TimerQueue,_std::default_delete<mario::TimerQueue>_>::operator->
                      (&this->_timerQueue);
  TVar2 = TimerQueue::addTimer(this_00,cb,TVar1,interval);
  return TVar2;
}

Assistant:

TimerId EventLoop::runEvery(double interval, const TimerCallback& cb) {
    Timestamp time(addTime(Timestamp::now(), interval));
    return _timerQueue->addTimer(cb, time, interval);
}